

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

size_t robin_hood::hash_bytes(void *ptr,size_t len)

{
  byte *pbVar1;
  unsigned_long uVar2;
  ulong uVar3;
  uint8_t *data8;
  unsigned_long k;
  size_t i;
  size_t n_blocks;
  uint64_t h;
  uint64_t *data64;
  size_t len_local;
  void *ptr_local;
  
  n_blocks = len * -0x395b586ca42e166b ^ 0xe17a1465;
  for (k = 0; k < len >> 3; k = k + 1) {
    uVar2 = detail::unaligned_load<unsigned_long>((void *)((long)ptr + k * 8));
    n_blocks = ((uVar2 * -0x395b586ca42e166b >> 0x2f ^ uVar2 * -0x395b586ca42e166b) *
                -0x395b586ca42e166b ^ n_blocks) * -0x395b586ca42e166b;
  }
  pbVar1 = (byte *)((long)ptr + (len >> 3) * 8);
  switch((uint)len & 7) {
  case 7:
    n_blocks = (ulong)pbVar1[6] << 0x30 ^ n_blocks;
  case 6:
    n_blocks = (ulong)pbVar1[5] << 0x28 ^ n_blocks;
  case 5:
    n_blocks = (ulong)pbVar1[4] << 0x20 ^ n_blocks;
  case 4:
    n_blocks = (ulong)pbVar1[3] << 0x18 ^ n_blocks;
  case 3:
    n_blocks = (ulong)pbVar1[2] << 0x10 ^ n_blocks;
  case 2:
    n_blocks = (ulong)pbVar1[1] << 8 ^ n_blocks;
  case 1:
    n_blocks = (*pbVar1 ^ n_blocks) * -0x395b586ca42e166b;
  default:
    uVar3 = (n_blocks >> 0x2f ^ n_blocks) * -0x395b586ca42e166b;
    return uVar3 >> 0x2f ^ uVar3;
  }
}

Assistant:

inline size_t hash_bytes(void const* ptr, size_t len) noexcept {
    static constexpr uint64_t m = UINT64_C(0xc6a4a7935bd1e995);
    static constexpr uint64_t seed = UINT64_C(0xe17a1465);
    static constexpr unsigned int r = 47;

    auto const* const data64 = static_cast<uint64_t const*>(ptr);
    uint64_t h = seed ^ (len * m);

    size_t const n_blocks = len / 8;
    for (size_t i = 0; i < n_blocks; ++i) {
        auto k = detail::unaligned_load<uint64_t>(data64 + i);

        k *= m;
        k ^= k >> r;
        k *= m;

        h ^= k;
        h *= m;
    }

    auto const* const data8 = reinterpret_cast<uint8_t const*>(data64 + n_blocks);
    switch (len & 7U) {
    case 7:
        h ^= static_cast<uint64_t>(data8[6]) << 48U;
        ROBIN_HOOD(FALLTHROUGH); // FALLTHROUGH
    case 6:
        h ^= static_cast<uint64_t>(data8[5]) << 40U;
        ROBIN_HOOD(FALLTHROUGH); // FALLTHROUGH
    case 5:
        h ^= static_cast<uint64_t>(data8[4]) << 32U;
        ROBIN_HOOD(FALLTHROUGH); // FALLTHROUGH
    case 4:
        h ^= static_cast<uint64_t>(data8[3]) << 24U;
        ROBIN_HOOD(FALLTHROUGH); // FALLTHROUGH
    case 3:
        h ^= static_cast<uint64_t>(data8[2]) << 16U;
        ROBIN_HOOD(FALLTHROUGH); // FALLTHROUGH
    case 2:
        h ^= static_cast<uint64_t>(data8[1]) << 8U;
        ROBIN_HOOD(FALLTHROUGH); // FALLTHROUGH
    case 1:
        h ^= static_cast<uint64_t>(data8[0]);
        h *= m;
        ROBIN_HOOD(FALLTHROUGH); // FALLTHROUGH
    default:
        break;
    }

    h ^= h >> r;
    h *= m;
    h ^= h >> r;
    return static_cast<size_t>(h);
}